

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::anon_unknown_10::LogFileObject::LogFileObject
          (LogFileObject *this,LogSeverity severity,char *base_filename)

{
  char *__s;
  char *local_50;
  allocator<char> local_2e;
  allocator<char> local_2d [13];
  char *local_20;
  char *base_filename_local;
  LogFileObject *pLStack_10;
  LogSeverity severity_local;
  LogFileObject *this_local;
  
  local_20 = base_filename;
  base_filename_local._4_4_ = severity;
  pLStack_10 = this;
  google::base::Logger::Logger(&this->super_Logger);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__LogFileObject_0015caf8;
  ::glog_internal_namespace_::Mutex::Mutex(&this->lock_);
  this->base_filename_selected_ = local_20 != (char *)0x0;
  if (local_20 == (char *)0x0) {
    local_50 = "";
  }
  else {
    local_50 = local_20;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->base_filename_,local_50,local_2d);
  std::allocator<char>::~allocator(local_2d);
  __s = glog_internal_namespace_::ProgramInvocationShortName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->symlink_basename_,__s,&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  std::__cxx11::string::string((string *)&this->filename_extension_);
  this->file_ = (FILE *)0x0;
  this->severity_ = base_filename_local._4_4_;
  this->bytes_since_flush_ = 0;
  this->dropped_mem_length_ = 0;
  this->file_length_ = 0;
  this->rollover_attempt_ = 0x1f;
  this->next_flush_time_ = 0;
  if (-1 < base_filename_local._4_4_) {
    if (base_filename_local._4_4_ < 4) {
      return;
    }
    __assert_fail("severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                  ,0x34e,
                  "google::(anonymous namespace)::LogFileObject::LogFileObject(LogSeverity, const char *)"
                 );
  }
  __assert_fail("severity >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                ,0x34d,
                "google::(anonymous namespace)::LogFileObject::LogFileObject(LogSeverity, const char *)"
               );
}

Assistant:

LogFileObject::LogFileObject(LogSeverity severity,
                             const char* base_filename)
  : base_filename_selected_(base_filename != NULL),
    base_filename_((base_filename != NULL) ? base_filename : ""),
    symlink_basename_(glog_internal_namespace_::ProgramInvocationShortName()),
    filename_extension_(),
    file_(NULL),
    severity_(severity),
    bytes_since_flush_(0),
    dropped_mem_length_(0),
    file_length_(0),
    rollover_attempt_(kRolloverAttemptFrequency-1),
    next_flush_time_(0) {
  assert(severity >= 0);
  assert(severity < NUM_SEVERITIES);
}